

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_command_runner.cc
# Opt level: O2

bool __thiscall MultipleCommandRunner::Finished(MultipleCommandRunner *this)

{
  _Elt_pointer ppVar1;
  bool bVar2;
  int iVar3;
  value_type *next;
  
  iVar3 = (*this->command_runner_->_vptr_CommandRunner[2])();
  if ((char)iVar3 != '\0') {
    bVar2 = PreviousCommandFailed(this);
    if (bVar2) {
      return true;
    }
    ppVar1 = (this->enqueued_commands_).c.
             super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->enqueued_commands_).c.
        super__Deque_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar1) {
      return true;
    }
    (*this->command_runner_->_vptr_CommandRunner[4])(this->command_runner_,ppVar1);
    this->ignore_failures_for_current_command_ = ppVar1->second;
    std::
    deque<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
    ::pop_front(&(this->enqueued_commands_).c);
  }
  return false;
}

Assistant:

bool MultipleCommandRunner::Finished() {
  if (!command_runner_->Finished())
    return false;
  if (PreviousCommandFailed())
    return true;

  if (!enqueued_commands_.empty()) {
    const auto& next = enqueued_commands_.front();
    command_runner_->RunCommand(next.first);
    ignore_failures_for_current_command_ = next.second;
    enqueued_commands_.pop();
    return false;
  }

  return true;
}